

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O3

void i2c_detect_devices(int bus)

{
  mraa_result_t mVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t value;
  uint8_t local_31;
  
  lVar2 = mraa_i2c_init();
  if (lVar2 != 0) {
    uVar4 = 0;
    do {
      if ((uVar4 & 0xf) == 0) {
        printf("%02x: ",uVar4);
      }
      mVar1 = i2c_get(bus,(uint8_t)uVar4,'\0',&local_31);
      if (mVar1 == MRAA_SUCCESS) {
        printf("%02x ",uVar4);
      }
      else {
        printf("-- ");
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      if ((uVar3 & 0xf) == 0) {
        putchar(10);
      }
    } while (uVar3 != 0x80);
  }
  return;
}

Assistant:

void
i2c_detect_devices(int bus)
{
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return;
    }
    int addr;
    for (addr = 0x0; addr < 0x80; ++addr) {
        uint8_t value;
        if ((addr) % 16 == 0)
            printf("%02x: ", addr);
        if (i2c_get(bus, addr, 0, &value) == MRAA_SUCCESS)
            printf("%02x ", addr);
        else
            printf("-- ");
        if ((addr + 1) % 16 == 0)
            printf("\n");
    }
}